

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::startCommand(QProcess *this,QString *command,OpenMode mode)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString program;
  QStringList args;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QList<QString> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  QString *program_00;
  QProcess *this_00;
  QStringView in_stack_ffffffffffffffc0;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> mode_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mode_00.i = 0xaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RDI);
  splitCommand(in_stack_ffffffffffffffc0);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x792360);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (char *)in_RDI,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffa8,
               "QProcess::startCommand: empty or whitespace-only command was provided");
  }
  else {
    program_00 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QProcess *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::takeFirst(in_stack_ffffffffffffff68);
    start(this_00,program_00,(QStringList *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),
          (OpenMode)mode_00.i);
    QString::~QString((QString *)0x792413);
  }
  QList<QString>::~QList((QList<QString> *)0x792428);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcess::startCommand(const QString &command, OpenMode mode)
{
    QStringList args = splitCommand(command);
    if (args.isEmpty()) {
        qWarning("QProcess::startCommand: empty or whitespace-only command was provided");
        return;
    }
    const QString program = args.takeFirst();
    start(program, args, mode);
}